

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

string * __thiscall
LinkedObjectFile::print_disassembly_abi_cxx11_
          (string *__return_storage_ptr__,LinkedObjectFile *this)

{
  pointer pvVar1;
  pointer pLVar2;
  _Alloc_hider _Var3;
  long lVar4;
  pointer puVar5;
  string *psVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Config *pCVar10;
  long *plVar11;
  pointer pvVar12;
  long *plVar13;
  size_type *psVar14;
  ulong uVar15;
  int iVar16;
  pointer pFVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  Instruction *this_00;
  LinkedWord *word;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  long *local_d0;
  ulong local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0;
  char local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong local_80;
  uint local_74;
  string local_70;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  pointer local_38;
  
  pCVar10 = get_config();
  local_a1 = pCVar10->write_hex_near_instructions;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar20 = (ulong)this->segments;
  local_b0 = __return_storage_ptr__;
  if (3 < (long)uVar20) {
    __assert_fail("segments <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x1fe,"std::string LinkedObjectFile::print_disassembly()");
  }
  if (0 < this->segments) {
    do {
      psVar6 = local_b0;
      std::__cxx11::string::append((char *)local_b0);
      uVar18 = uVar20 - 1;
      std::__cxx11::string::append((char *)psVar6);
      std::__cxx11::string::append((char *)psVar6);
      pvVar1 = (this->functions_by_seg).
               super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = ((long)(this->functions_by_seg).
                      super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
               -0x5555555555555555;
      local_40 = uVar20;
      if (uVar15 < uVar18 || uVar15 - uVar18 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar18);
      }
      local_50 = uVar18 * 3;
      pFVar17 = pvVar1[uVar18].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = *(pointer *)
                  ((long)&pvVar1[uVar18].super__Vector_base<Function,_std::allocator<Function>_>.
                          _M_impl.super__Vector_impl_data + 8);
      iVar9 = (int)uVar18;
      if (pFVar17 != local_38) {
        do {
          std::__cxx11::string::append((char *)local_b0);
          std::operator+(&local_a0,"; .function ",&pFVar17->guessed_name);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_d0 = &local_c0;
          plVar13 = plVar11 + 2;
          if ((long *)*plVar11 == plVar13) {
            local_c0 = *plVar13;
            lStack_b8 = plVar11[3];
          }
          else {
            local_c0 = *plVar13;
            local_d0 = (long *)*plVar11;
          }
          local_c8 = plVar11[1];
          *plVar11 = (long)plVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_b0);
          Function::Prologue::to_string_abi_cxx11_(&local_a0,&pFVar17->prologue,2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_d0 = &local_c0;
          plVar13 = plVar11 + 2;
          if ((long *)*plVar11 == plVar13) {
            local_c0 = *plVar13;
            lStack_b8 = plVar11[3];
          }
          else {
            local_c0 = *plVar13;
            local_d0 = (long *)*plVar11;
          }
          local_c8 = plVar11[1];
          *plVar11 = (long)plVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar20 = (ulong)(uint)pFVar17->start_word;
          if (1 < pFVar17->end_word - pFVar17->start_word) {
            uVar15 = 1;
            iVar16 = 1;
            local_74 = 0;
            do {
              local_80 = uVar15;
              iVar7 = get_label_at(this,iVar9,((int)uVar15 + (int)uVar20) * 4);
              if (iVar7 != -1) {
                uVar15 = (ulong)iVar7;
                pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar20 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) *
                         -0x3333333333333333;
                if (uVar20 < uVar15 || uVar20 - uVar15 == 0) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                }
                local_d0 = &local_c0;
                _Var3._M_p = pLVar2[uVar15].name._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d0,_Var3._M_p,
                           _Var3._M_p + pLVar2[uVar15].name._M_string_length);
                std::__cxx11::string::append((char *)&local_d0);
                std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
                if (local_d0 != &local_c0) {
                  operator_delete(local_d0,local_c0 + 1);
                }
              }
              iVar7 = 1;
              do {
                iVar8 = get_label_at(this,iVar9,iVar7 + (pFVar17->start_word + iVar16) * 4);
                if (iVar8 != -1) {
                  std::__cxx11::string::append((char *)local_b0);
                  iVar9 = get_label_at(this,iVar9,iVar7 + (iVar16 + pFVar17->start_word) * 4);
                  uVar18 = (ulong)iVar9;
                  pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar20 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) *
                           -0x3333333333333333;
                  if (uVar20 < uVar18 || uVar20 - uVar18 == 0) {
                    std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                  }
                  local_d0 = &local_c0;
                  _Var3._M_p = pLVar2[uVar18].name._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_d0,_Var3._M_p,
                             _Var3._M_p + pLVar2[uVar18].name._M_string_length);
                  std::__cxx11::string::append((char *)&local_d0);
                  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_d0);
                  std::__cxx11::string::~string((string *)&local_d0);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                                ,0x21a,"std::string LinkedObjectFile::print_disassembly()");
                }
                iVar7 = iVar7 + 1;
              } while (iVar7 != 4);
              lVar4 = *(long *)&(pFVar17->instructions).
                                super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                                _M_impl.super__Vector_impl_data;
              uVar20 = ((long)*(pointer *)
                               ((long)&(pFVar17->instructions).
                                       super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                       ._M_impl + 8) - lVar4 >> 4) * 0x4ec4ec4ec4ec4ec5;
              if (uVar20 < local_80 || uVar20 - local_80 == 0) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              this_00 = (Instruction *)(lVar4 + local_80 * 0xd0);
              Instruction::to_string_abi_cxx11_(&local_a0,this_00,this);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_a0,0,(char *)0x0,0x14aca3);
              local_d0 = &local_c0;
              plVar13 = plVar11 + 2;
              if ((long *)*plVar11 == plVar13) {
                local_c0 = *plVar13;
                lStack_b8 = plVar11[3];
              }
              else {
                local_c0 = *plVar13;
                local_d0 = (long *)*plVar11;
              }
              local_c8 = plVar11[1];
              *plVar11 = (long)plVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_a1 == '\0') {
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a0,local_d0,local_c8 + (long)local_d0);
                std::__cxx11::string::append((char *)&local_a0);
                std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_a0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                if (local_c8 < 0x3c) {
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)&local_d0,local_c8,0,'<' - (char)local_c8);
                }
                std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
                std::__cxx11::string::append((char *)local_b0);
                pvVar12 = (this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar15 = (long)(int)local_80 + (long)pFVar17->start_word;
                lVar4 = *(long *)((long)&(pvVar12->
                                         super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                                         )._M_impl.super__Vector_impl_data + local_50 * 8);
                uVar20 = (*(long *)((long)&(pvVar12->
                                           super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                                           )._M_impl.super__Vector_impl_data + local_50 * 8 + 8) -
                          lVar4 >> 4) * -0x5555555555555555;
                if (uVar20 < uVar15 || uVar20 - uVar15 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar15,uVar20);
                }
                append_word_to_string(this,local_b0,(LinkedWord *)(lVar4 + uVar15 * 0x30));
              }
              if ((local_74 & 1) != 0) {
                std::__cxx11::string::append((char *)local_b0);
                local_74 = 0;
              }
              local_74 = local_74 & 0xff;
              if (gOpcodeInfo[(int)this_00->kind].has_delay_slot != false) {
                local_74 = 1;
              }
              if (local_d0 != &local_c0) {
                operator_delete(local_d0,local_c0 + 1);
              }
              uVar15 = local_80 + 1;
              uVar20 = (ulong)pFVar17->start_word;
              iVar16 = iVar16 + 1;
            } while ((long)uVar15 < (long)((long)pFVar17->end_word - uVar20));
          }
          std::__cxx11::string::append((char *)local_b0);
          pFVar17 = pFVar17 + 1;
        } while (pFVar17 != local_38);
      }
      puVar5 = (this->offset_of_data_zone_by_seg).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)((long)(this->offset_of_data_zone_by_seg).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar5 >> 2) <= uVar18) ||
         (pvVar12 = (this->words_by_seg).
                    super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         uVar20 = ((long)(this->words_by_seg).
                         super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >> 3) *
                  -0x5555555555555555, uVar20 < uVar18 || uVar20 - uVar18 == 0)) {
LAB_00130c63:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar18);
      }
      uVar19 = puVar5[uVar18];
      uVar20 = (ulong)uVar19;
      iVar16 = uVar19 * 4;
      while (uVar20 < (ulong)((*(long *)((long)&(pvVar12->
                                                super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                                                )._M_impl.super__Vector_impl_data + local_50 * 8 + 8
                                        ) -
                               *(long *)((long)&(pvVar12->
                                                super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>
                                                )._M_impl.super__Vector_impl_data + local_50 * 8) >>
                              4) * -0x5555555555555555)) {
        uVar19 = 0;
        local_80 = uVar20;
        do {
          iVar7 = get_label_at(this,iVar9,uVar19 + iVar16);
          if (iVar7 != -1) {
            uVar15 = (ulong)iVar7;
            pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar20 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) *
                     -0x3333333333333333;
            if (uVar20 < uVar15 || uVar20 - uVar15 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            local_d0 = &local_c0;
            _Var3._M_p = pLVar2[uVar15].name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,_Var3._M_p,
                       _Var3._M_p + pLVar2[uVar15].name._M_string_length);
            std::__cxx11::string::append((char *)&local_d0);
            std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if (uVar19 != 0) {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
              std::__detail::__to_chars_10_impl<unsigned_int>(local_70._M_dataplus._M_p,1,uVar19);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_70,0,(char *)0x0,0x14a943);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              psVar14 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_a0.field_2._M_allocated_capacity = *psVar14;
                local_a0.field_2._8_8_ = plVar11[3];
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar14;
                local_a0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_a0._M_string_length = plVar11[1];
              *plVar11 = (long)psVar14;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
              local_d0 = &local_c0;
              plVar13 = plVar11 + 2;
              if ((long *)*plVar11 == plVar13) {
                local_c0 = *plVar13;
                lStack_b8 = plVar11[3];
              }
              else {
                local_c0 = *plVar13;
                local_d0 = (long *)*plVar11;
              }
              local_c8 = plVar11[1];
              *plVar11 = (long)plVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
              if (local_d0 != &local_c0) {
                operator_delete(local_d0,local_c0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
            }
            std::__cxx11::string::append((char *)local_b0);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != 4);
        word = (LinkedWord *)
               (local_80 * 0x30 +
               *(long *)((long)&(((this->words_by_seg).
                                  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl
                                .super__Vector_impl_data + local_50 * 8));
        append_word_to_string(this,local_b0,word);
        if ((word->kind == TYPE_PTR) &&
           (iVar7 = std::__cxx11::string::compare((char *)&word->symbol_name), iVar7 == 0)) {
          get_goal_string_abi_cxx11_(&local_70,this,iVar9,(int)local_80);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x148010);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          psVar14 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_a0.field_2._M_allocated_capacity = *psVar14;
            local_a0.field_2._8_8_ = plVar11[3];
          }
          else {
            local_a0.field_2._M_allocated_capacity = *psVar14;
            local_a0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_a0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_d0 = &local_c0;
          plVar13 = plVar11 + 2;
          if ((long *)*plVar11 == plVar13) {
            local_c0 = *plVar13;
            lStack_b8 = plVar11[3];
          }
          else {
            local_c0 = *plVar13;
            local_d0 = (long *)*plVar11;
          }
          local_c8 = plVar11[1];
          *plVar11 = (long)plVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        uVar20 = local_80 + 1;
        pvVar12 = (this->words_by_seg).
                  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(this->words_by_seg).
                        super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >> 3) *
                 -0x5555555555555555;
        iVar16 = iVar16 + 4;
        if (uVar15 < uVar18 || uVar15 - uVar18 == 0) goto LAB_00130c63;
      }
      uVar20 = uVar18;
    } while (1 < (long)local_40);
  }
  return local_b0;
}

Assistant:

std::string LinkedObjectFile::print_disassembly() {
  bool write_hex = get_config().write_hex_near_instructions;
  std::string result;

  assert(segments <= 3);
  for (int seg = segments; seg-- > 0;) {
    // segment header
    result += ";------------------------------------------\n;  ";
    result += segment_names[seg];
    result += "\n;------------------------------------------\n\n";

    // functions
    for (auto& func : functions_by_seg.at(seg)) {
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += "; .function " + func.guessed_name + "\n";
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += func.prologue.to_string(2) + "\n";

      // print each instruction in the function.
      bool in_delay_slot = false;

      for (int i = 1; i < func.end_word - func.start_word; i++) {
        auto label_id = get_label_at(seg, (func.start_word + i) * 4);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":\n";
        }

        for (int j = 1; j < 4; j++) {
          //          assert(get_label_at(seg, (func.start_word + i)*4 + j) == -1);
          if (get_label_at(seg, (func.start_word + i) * 4 + j) != -1) {
            result += "BAD OFFSET LABEL: ";
            result += labels.at(get_label_at(seg, (func.start_word + i) * 4 + j)).name + "\n";
            assert(false);
          }
        }

        auto& instr = func.instructions.at(i);
        std::string line = "    " + instr.to_string(*this);

        if (write_hex) {
          if (line.length() < 60) {
            line.append(60 - line.length(), ' ');
          }
          result += line;
          result += " ;;";
          auto& word = words_by_seg[seg].at(func.start_word + i);
          append_word_to_string(result, word);
        } else {
          result += line + "\n";
        }

        if (in_delay_slot) {
          result += "\n";
          in_delay_slot = false;
        }

        if (gOpcodeInfo[(int)instr.kind].has_delay_slot) {
          in_delay_slot = true;
        }
      }
      result += "\n";
      //
      //      int bid = 0;
      //      for(auto& bblock : func.basic_blocks) {
      //        result += "BLOCK " + std::to_string(bid++)+ "\n";
      //        for(int i = bblock.start_word; i < bblock.end_word; i++) {
      //          if(i >= 0 && i < func.instructions.size()) {
      //            result += func.instructions.at(i).to_string(*this) + "\n";
      //          } else {
      //            result += "BAD BBLOCK INSTR ID " + std::to_string(i);
      //          }
      //        }
      //      }
    }

    // print data
    for (size_t i = offset_of_data_zone_by_seg.at(seg); i < words_by_seg.at(seg).size(); i++) {
      for (int j = 0; j < 4; j++) {
        auto label_id = get_label_at(seg, i * 4 + j);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":";
          if (j != 0) {
            result += " (offset " + std::to_string(j) + ")";
          }
          result += "\n";
        }
      }

      auto& word = words_by_seg[seg][i];
      append_word_to_string(result, word);

      if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "string") {
        result += "; " + get_goal_string(seg, i) + "\n";
      }
    }
  }

  return result;
}